

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_cwksp.h
# Opt level: O2

size_t ZSTD_cwksp_internal_advance_phase(ZSTD_cwksp *ws,ZSTD_cwksp_alloc_phase_e phase)

{
  ZSTD_cwksp_alloc_phase_e ZVar1;
  void *pvVar2;
  ulong uVar3;
  
  ZVar1 = ws->phase;
  if (phase < ZVar1) {
    __assert_fail("phase >= ws->phase",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_cwksp.h"
                  ,0x13b,
                  "size_t ZSTD_cwksp_internal_advance_phase(ZSTD_cwksp *, ZSTD_cwksp_alloc_phase_e)"
                 );
  }
  if (ZVar1 < phase) {
    if (ZVar1 == ZSTD_cwksp_alloc_objects) {
      pvVar2 = ws->objectEnd;
      ws->tableValidEnd = pvVar2;
      ws->initOnceStart = (void *)((ulong)ws->workspaceEnd & 0xffffffffffffffc0);
      uVar3 = (ulong)(-(int)pvVar2 & 0x3f);
      pvVar2 = (void *)((long)pvVar2 + uVar3);
      if (ws->workspaceEnd < pvVar2) {
        return 0xffffffffffffffc0;
      }
      ws->objectEnd = pvVar2;
      ws->tableEnd = pvVar2;
      if (uVar3 != 0) {
        ws->tableValidEnd = pvVar2;
      }
    }
    ws->phase = phase;
    ZSTD_cwksp_assert_internal_consistency(ws);
  }
  return 0;
}

Assistant:

MEM_STATIC size_t
ZSTD_cwksp_internal_advance_phase(ZSTD_cwksp* ws, ZSTD_cwksp_alloc_phase_e phase)
{
    assert(phase >= ws->phase);
    if (phase > ws->phase) {
        /* Going from allocating objects to allocating initOnce / tables */
        if (ws->phase < ZSTD_cwksp_alloc_aligned_init_once &&
            phase >= ZSTD_cwksp_alloc_aligned_init_once) {
            ws->tableValidEnd = ws->objectEnd;
            ws->initOnceStart = ZSTD_cwksp_initialAllocStart(ws);

            {   /* Align the start of the tables to 64 bytes. Use [0, 63] bytes */
                void *const alloc = ws->objectEnd;
                size_t const bytesToAlign = ZSTD_cwksp_bytes_to_align_ptr(alloc, ZSTD_CWKSP_ALIGNMENT_BYTES);
                void *const objectEnd = (BYTE *) alloc + bytesToAlign;
                DEBUGLOG(5, "reserving table alignment addtl space: %zu", bytesToAlign);
                RETURN_ERROR_IF(objectEnd > ws->workspaceEnd, memory_allocation,
                                "table phase - alignment initial allocation failed!");
                ws->objectEnd = objectEnd;
                ws->tableEnd = objectEnd;  /* table area starts being empty */
                if (ws->tableValidEnd < ws->tableEnd) {
                    ws->tableValidEnd = ws->tableEnd;
                }
            }
        }
        ws->phase = phase;
        ZSTD_cwksp_assert_internal_consistency(ws);
    }
    return 0;
}